

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<std::pair<long,_long>_>::Resize
          (TPZVec<std::pair<long,_long>_> *this,int64_t newsize,pair<long,_long> *object)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pair<long,_long> *ppVar3;
  undefined8 uVar4;
  pair<long,_long> *__s;
  ostream *poVar5;
  long lVar6;
  pair<long,_long> *ppVar7;
  long lVar8;
  long lVar9;
  
  if (newsize < 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::ostream::flush();
    return;
  }
  lVar8 = this->fNElements;
  if (lVar8 != newsize) {
    if (newsize == 0) {
      __s = (pair<long,_long> *)0x0;
    }
    else {
      __s = (pair<long,_long> *)operator_new__(-(ulong)((ulong)newsize >> 0x3c != 0) | newsize << 4)
      ;
      memset(__s,0,newsize << 4);
    }
    if (newsize <= lVar8) {
      lVar8 = newsize;
    }
    ppVar3 = this->fStore;
    lVar6 = 0;
    lVar9 = lVar8;
    if (lVar8 < 1) {
      lVar8 = lVar6;
      lVar9 = lVar6;
    }
    while (lVar8 != 0) {
      puVar1 = (undefined8 *)((long)&ppVar3->first + lVar6);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&__s->first + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      lVar6 = lVar6 + 0x10;
      lVar8 = lVar8 + -1;
    }
    lVar8 = object->first;
    lVar6 = object->second;
    ppVar7 = __s + lVar9;
    for (; lVar9 < newsize; lVar9 = lVar9 + 1) {
      ppVar7->first = lVar8;
      ppVar7->second = lVar6;
      ppVar7 = ppVar7 + 1;
    }
    if (ppVar3 != (pair<long,_long> *)0x0) {
      operator_delete__(ppVar3);
    }
    this->fStore = __s;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}